

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void llvm::SmallVectorTemplateBase<std::pair<unsigned_long,_llvm::DILineInfo>,_false>::destroy_range
               (pair<unsigned_long,_llvm::DILineInfo> *S,pair<unsigned_long,_llvm::DILineInfo> *E)

{
  for (; E != S; E = E + -1) {
    DILineInfo::~DILineInfo(&E[-1].second);
  }
  return;
}

Assistant:

static void destroy_range(T *S, T *E) {
    while (S != E) {
      --E;
      E->~T();
    }
  }